

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

void __thiscall
QPDFWriter::writeObjectStreamOffsets
          (QPDFWriter *this,vector<long_long,_std::allocator<long_long>_> *offsets,int first_obj)

{
  element_type *peVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  long *plVar5;
  uint uVar6;
  long *__n;
  char cVar7;
  long *plVar8;
  uint __uval;
  long *__val;
  uint uVar9;
  pointer plVar10;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  long *local_78;
  void *local_70;
  long local_68 [2];
  long *local_58;
  long *local_50;
  long local_48;
  long lStack_40;
  pointer local_38;
  
  if (first_obj < 1) {
    __assert_fail("first_obj > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                  ,0x65c,
                  "void QPDFWriter::writeObjectStreamOffsets(std::vector<qpdf_offset_t> &, int)");
  }
  uVar9 = 1;
  if (9 < (uint)first_obj) {
    uVar6 = first_obj;
    uVar3 = 4;
    do {
      uVar9 = uVar3;
      if (uVar6 < 100) {
        uVar9 = uVar9 - 2;
        goto LAB_001eefd0;
      }
      if (uVar6 < 1000) {
        uVar9 = uVar9 - 1;
        goto LAB_001eefd0;
      }
      if (uVar6 < 10000) goto LAB_001eefd0;
      bVar4 = 99999 < uVar6;
      uVar6 = uVar6 / 10000;
      uVar3 = uVar9 + 4;
    } while (bVar4);
    uVar9 = uVar9 + 1;
  }
LAB_001eefd0:
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar9);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,uVar9,first_obj);
  plVar5 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_78,(ulong)local_70,0,'\x01');
  local_58 = &local_48;
  __n = plVar5 + 2;
  if ((long *)*plVar5 == __n) {
    local_48 = *__n;
    lStack_40 = plVar5[3];
  }
  else {
    local_48 = *__n;
    local_58 = (long *)*plVar5;
  }
  local_50 = (long *)plVar5[1];
  *plVar5 = (long)__n;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  plVar10 = (offsets->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
            super__Vector_impl_data._M_start;
  local_38 = (offsets->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (plVar10 != local_38) {
    bVar4 = true;
    do {
      if (bVar4) {
        bVar4 = false;
      }
      else {
        peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (peVar1->qdf_mode == true) {
          ::qpdf::pl::Count::write(peVar1->pipeline,0x27dc4d,(void *)0x1,(size_t)__n);
        }
        peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        if (peVar1->qdf_mode == false) {
          ::qpdf::pl::Count::write(peVar1->pipeline,0x27daec,(void *)0x1,(size_t)__n);
        }
      }
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_58,local_50,(size_t)__n);
      __n = local_50;
      if ((long *)((long)local_58 + (long)local_50 + -1) != local_58) {
        do {
          cVar7 = *(char *)((long)local_58 + -2 + (long)__n) + '\x01';
          *(char *)((long)local_58 + -2 + (long)__n) = cVar7;
          if (cVar7 != ':') goto LAB_001ef152;
          *(undefined1 *)((long)local_58 + -2 + (long)__n) = 0x30;
          __n = (long *)((long)__n + -1);
        } while (__n != (long *)0x1);
      }
      __n = (long *)0x31;
      std::__cxx11::string::insert((ulong)&local_58,0,'\x01');
LAB_001ef152:
      plVar5 = (long *)*plVar10;
      __val = (long *)-(long)plVar5;
      if (0 < (long)plVar5) {
        __val = plVar5;
      }
      uVar9 = 1;
      if ((long *)0x9 < __val) {
        __n = __val;
        uVar6 = 4;
        do {
          uVar9 = uVar6;
          if (__n < (long *)0x64) {
            uVar9 = uVar9 - 2;
            goto LAB_001ef1b5;
          }
          if (__n < (long *)0x3e8) {
            uVar9 = uVar9 - 1;
            goto LAB_001ef1b5;
          }
          if (__n < (long *)0x2710) goto LAB_001ef1b5;
          plVar8 = (long *)((ulong)__n / 10000);
          bVar2 = (long *)0x1869f < __n;
          __n = plVar8;
          uVar6 = uVar9 + 4;
        } while (bVar2);
        uVar9 = uVar9 + 1;
      }
LAB_001ef1b5:
      local_78 = local_68;
      std::__cxx11::string::_M_construct
                ((ulong)&local_78,(char)uVar9 - (char)((long)plVar5 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                ((char *)((long)local_78 - ((long)plVar5 >> 0x3f)),uVar9,(unsigned_long_long)__val);
      ::qpdf::pl::Count::write
                (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->pipeline,(int)local_78,local_70,(size_t)__n);
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      plVar10 = plVar10 + 1;
    } while (plVar10 != local_38);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27dc4d,(void *)0x1,(size_t)__n);
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  return;
}

Assistant:

void
QPDFWriter::writeObjectStreamOffsets(std::vector<qpdf_offset_t>& offsets, int first_obj)
{
    qpdf_assert_debug(first_obj > 0);
    bool is_first = true;
    auto id = std::to_string(first_obj) + ' ';
    for (auto& offset: offsets) {
        if (is_first) {
            is_first = false;
        } else {
            writeStringQDF("\n");
            writeStringNoQDF(" ");
        }
        writeString(id);
        util::increment(id, 1);
        writeString(std::to_string(offset));
    }
    writeString("\n");
}